

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sizeclasstable.h
# Opt level: O0

smallsizeclass_t snmalloc::size_to_sizeclass(size_t size)

{
  size_t sVar1;
  size_t in_RDI;
  size_t index;
  ulong local_8;
  
  sVar1 = sizeclass_lookup_index(in_RDI);
  if (sVar1 < 0xfff) {
    local_8 = (ulong)(byte)(&sizeclass_lookup)[sVar1];
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

constexpr smallsizeclass_t size_to_sizeclass(size_t size)
  {
    auto index = sizeclass_lookup_index(size);
    if (index < sizeclass_lookup_size)
    {
      return sizeclass_lookup.table[index];
    }

    // Check this is not called on large sizes.
    SNMALLOC_ASSERT(size == 0);
    // Map size == 0 to the first sizeclass.
    return 0;
  }